

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  bool local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  long local_68;
  size_type loc;
  byte local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *value_local;
  string *name_local;
  string *current_local;
  
  local_28 = value;
  value_local = name;
  name_local = current;
  uVar2 = ::std::__cxx11::string::size();
  local_49 = 0;
  local_c9 = false;
  if (2 < uVar2) {
    ::std::__cxx11::string::substr((ulong)&local_48,(ulong)name_local);
    local_49 = 1;
    bVar1 = ::std::operator==(&local_48,"--");
    local_c9 = false;
    if (bVar1) {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name_local);
      local_c9 = valid_first_char<char>(*pcVar3);
    }
  }
  if ((local_49 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  if (local_c9 == false) {
    current_local._7_1_ = false;
  }
  else {
    local_68 = ::std::__cxx11::string::find((char *)name_local,0x175cab);
    if (local_68 == -1) {
      ::std::__cxx11::string::substr((ulong)local_c8,(ulong)name_local);
      ::std::__cxx11::string::operator=((string *)value_local,local_c8);
      ::std::__cxx11::string::~string(local_c8);
      ::std::__cxx11::string::operator=((string *)local_28,"");
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_88,(ulong)name_local);
      ::std::__cxx11::string::operator=((string *)value_local,local_88);
      ::std::__cxx11::string::~string(local_88);
      ::std::__cxx11::string::substr((ulong)local_a8,(ulong)name_local);
      ::std::__cxx11::string::operator=((string *)local_28,local_a8);
      ::std::__cxx11::string::~string(local_a8);
    }
    current_local._7_1_ = true;
  }
  return current_local._7_1_;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find("=");
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    } else
        return false;
}